

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bxdfs.cpp
# Opt level: O0

ostream * pbrt::operator<<(ostream *os,Type value)

{
  undefined4 in_ESI;
  ostream *in_RDI;
  
  switch(in_ESI) {
  case 0:
    std::operator<<(in_RDI,"invalid");
    break;
  case 1:
    std::operator<<(in_RDI,"uint8_t");
    break;
  case 2:
    std::operator<<(in_RDI,"int8_t");
    break;
  case 3:
    std::operator<<(in_RDI,"uint16_t");
    break;
  case 4:
    std::operator<<(in_RDI,"int16_t");
    break;
  case 5:
    std::operator<<(in_RDI,"uint32_t");
    break;
  case 6:
    std::operator<<(in_RDI,"int8_t");
    break;
  case 7:
    std::operator<<(in_RDI,"uint64_t");
    break;
  case 8:
    std::operator<<(in_RDI,"int64_t");
    break;
  case 9:
    std::operator<<(in_RDI,"float16_t");
    break;
  case 10:
    std::operator<<(in_RDI,"float32_t");
    break;
  case 0xb:
    std::operator<<(in_RDI,"float64_t");
    break;
  default:
    std::operator<<(in_RDI,"unknown");
  }
  return in_RDI;
}

Assistant:

static std::ostream &operator<<(std::ostream &os, Tensor::Type value) {
    switch (value) {
    case Tensor::Invalid:
        os << "invalid";
        break;
    case Tensor::UInt8:
        os << "uint8_t";
        break;
    case Tensor::Int8:
        os << "int8_t";
        break;
    case Tensor::UInt16:
        os << "uint16_t";
        break;
    case Tensor::Int16:
        os << "int16_t";
        break;
    case Tensor::UInt32:
        os << "uint32_t";
        break;
    case Tensor::Int32:
        os << "int8_t";
        break;
    case Tensor::UInt64:
        os << "uint64_t";
        break;
    case Tensor::Int64:
        os << "int64_t";
        break;
    case Tensor::Float16:
        os << "float16_t";
        break;
    case Tensor::Float32:
        os << "float32_t";
        break;
    case Tensor::Float64:
        os << "float64_t";
        break;
    default:
        os << "unknown";
        break;
    }
    return os;
}